

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void HistoQueueFixPair(int bad_id,int good_id,HistogramPair *pair)

{
  int iVar1;
  int tmp;
  HistogramPair *pair_local;
  int good_id_local;
  int bad_id_local;
  
  if (pair->idx1 == bad_id) {
    pair->idx1 = good_id;
  }
  if (pair->idx2 == bad_id) {
    pair->idx2 = good_id;
  }
  if (pair->idx2 < pair->idx1) {
    iVar1 = pair->idx1;
    pair->idx1 = pair->idx2;
    pair->idx2 = iVar1;
  }
  return;
}

Assistant:

static void HistoQueueFixPair(int bad_id, int good_id,
                              HistogramPair* const pair) {
  if (pair->idx1 == bad_id) pair->idx1 = good_id;
  if (pair->idx2 == bad_id) pair->idx2 = good_id;
  if (pair->idx1 > pair->idx2) {
    const int tmp = pair->idx1;
    pair->idx1 = pair->idx2;
    pair->idx2 = tmp;
  }
}